

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QtWidgetsExtraCache.cpp
# Opt level: O1

QtWidgetsExtraCache * __thiscall
QtWidgetsExtraCache::cachedPixmapColor(QtWidgetsExtraCache *this,QColor *color,QSize *size)

{
  qsizetype qVar1;
  char cVar2;
  QString key;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  
  local_b8.d = (Data *)0x0;
  local_b8.ptr = L"%1-%2x%3-pixmap";
  local_b8.size = 0xf;
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  QColor::name((NameFormat)&local_38);
  QString::arg((QString *)&local_a0,(int)&local_b8,(QChar)(char16_t)&local_38);
  QString::arg((longlong)&local_70,(int)&local_a0,size->wd,(QChar)0x0);
  QString::arg((longlong)&local_88,(int)&local_70,size->ht,(QChar)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  cachedPixmap(this,(QString *)&local_88);
  cVar2 = QPixmap::isNull();
  if (cVar2 != '\0') {
    QPixmap::QPixmap((QPixmap *)&local_a0,size);
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_70);
    qVar1 = local_a0.size;
    local_70.d = (Data *)QIcon::isNull;
    local_a0.size = 0;
    local_70.size = *(qsizetype *)(this + 0x10);
    *(qsizetype *)(this + 0x10) = qVar1;
    QPixmap::~QPixmap((QPixmap *)&local_70);
    QPixmap::~QPixmap((QPixmap *)&local_a0);
    QPixmap::fill((QColor *)this);
    cachePixmap((QString *)&local_88,(QPixmap *)this);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  return this;
}

Assistant:

QPixmap QtWidgetsExtraCache::cachedPixmapColor(const QColor &color, const QSize &size) {
    const QString key = QString(QStringLiteral("%1-%2x%3-pixmap"))
                            .arg(color.name(QColor::HexArgb))
                            .arg(size.width())
                            .arg(size.height());
    QPixmap pixmap = QtWidgetsExtraCache::cachedPixmap(key);

    if (pixmap.isNull()) {
        pixmap = QPixmap(size);
        pixmap.fill(color);
        QtWidgetsExtraCache::cachePixmap(key, pixmap);
    }

    return pixmap;
}